

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

bool __thiscall SQVM::CLASS_OP(SQVM *this,SQObjectPtr *target,SQInteger baseclass)

{
  SQObjectPtr *obj1;
  SQObjectPtr *pSVar1;
  SQClass *pSVar2;
  SQChar *pSVar3;
  
  if (baseclass == -1) {
    pSVar2 = (SQClass *)0x0;
  }
  else {
    pSVar1 = (this->_stack)._vals;
    obj1 = pSVar1 + this->_stackbase + baseclass;
    if (pSVar1[this->_stackbase + baseclass].super_SQObject._type != OT_CLASS) {
      pSVar3 = GetTypeName(obj1);
      Raise_Error(this,"trying to inherit from a %s",pSVar3);
      return false;
    }
    pSVar2 = (obj1->super_SQObject)._unVal.pClass;
  }
  pSVar2 = SQClass::Create(this,pSVar2);
  if (pSVar2 != (SQClass *)0x0) {
    SQObjectPtr::operator=(target,pSVar2);
  }
  return pSVar2 != (SQClass *)0x0;
}

Assistant:

bool SQVM::CLASS_OP(SQObjectPtr &target,SQInteger baseclass)
{
    SQClass *base = NULL;
    if(baseclass != -1) {
        if (sq_type(_stack._vals[_stackbase+baseclass]) != OT_CLASS) {
            Raise_Error(_SC("trying to inherit from a %s"),GetTypeName(_stack._vals[_stackbase+baseclass]));
            return false;
        }
        base = _class(_stack._vals[_stackbase + baseclass]);
    }
    SQClass *cls = SQClass::Create(this, base);
    if (!cls)
        return false;
    target = cls;
    return true;
}